

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

bool __thiscall
TPZMatrix<std::complex<long_double>_>::CompareValues
          (TPZMatrix<std::complex<long_double>_> *this,TPZMatrix<std::complex<long_double>_> *M,
          complex<long_double> tol)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  longdouble in_ST0;
  longdouble lVar5;
  longdouble in_ST1;
  longdouble lVar6;
  longdouble in_ST2;
  longdouble lVar7;
  longdouble in_ST3;
  longdouble in_ST4;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined2 uStack_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined2 uStack_a0;
  long local_98;
  double local_90;
  double local_88;
  unkbyte10 local_7c;
  unkbyte10 local_70;
  longdouble local_64;
  longdouble local_58;
  longdouble local_48;
  
  local_98 = (this->super_TPZBaseMatrix).fRow;
  bVar2 = false;
  if ((((M->super_TPZBaseMatrix).fRow == local_98) &&
      (lVar1 = (this->super_TPZBaseMatrix).fCol, bVar2 = false,
      (M->super_TPZBaseMatrix).fCol == lVar1)) && (bVar2 = local_98 < 1, 0 < local_98)) {
    local_70 = tol._M_value._0_10_;
    local_7c = tol._M_value._16_10_;
    lVar3 = 0;
    do {
      if (0 < lVar1) {
        lVar4 = 0;
        lVar5 = in_ST1;
        do {
          in_ST1 = in_ST3;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    (&local_b8,this,lVar3,lVar4);
          (*(M->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    (&local_58,M,lVar3,lVar4);
          lVar7 = (longdouble)CONCAT28(uStack_b0,CONCAT44(uStack_b4,local_b8)) - local_58;
          lVar6 = (longdouble)CONCAT28(uStack_a0,CONCAT44(uStack_a4,local_a8)) - local_48;
          local_b8 = SUB104(lVar7,0);
          uStack_b4 = (undefined4)((unkuint10)lVar7 >> 0x20);
          uStack_b0 = (undefined2)((unkuint10)lVar7 >> 0x40);
          local_a8 = SUB104(lVar6,0);
          uStack_a4 = (undefined4)((unkuint10)lVar6 >> 0x20);
          uStack_a0 = (undefined2)((unkuint10)lVar6 >> 0x40);
          in_ST3 = in_ST4;
          lVar6 = in_ST4;
          cabsl();
          local_88 = (double)in_ST0;
          local_90 = ABS(local_88);
          local_64 = (longdouble)local_90;
          local_b8 = (undefined4)local_70;
          uStack_b4 = SUB104(local_70,4);
          uStack_b0 = SUB102(local_70,8);
          local_a8 = (undefined4)local_7c;
          uStack_a4 = SUB104(local_7c,4);
          uStack_a0 = SUB102(local_7c,8);
          in_ST0 = in_ST2;
          in_ST2 = in_ST4;
          in_ST4 = lVar6;
          cabsl();
          if (ABS(lVar5) < local_64) {
            return bVar2;
          }
          lVar4 = lVar4 + 1;
          lVar5 = in_ST1;
        } while (lVar1 != lVar4);
      }
      lVar3 = lVar3 + 1;
      bVar2 = local_98 <= lVar3;
    } while (lVar3 != local_98);
  }
  return bVar2;
}

Assistant:

const TPZFMatrix<TVar> TPZMatrix<TVar>::Storage() const
{
  const auto size = Size();
  const auto elem = Elem();
	TPZFMatrix<TVar> ref(size,1,const_cast<TVar*>(elem),size);
	return ref;
}